

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tensor.h
# Opt level: O0

void __thiscall
cnn::Tensor::load<boost::archive::text_iarchive>(Tensor *this,text_iarchive *ar,uint param_3)

{
  void *pvVar1;
  Dim *in_RDI;
  size_t in_stack_00000008;
  size_t in_stack_00000010;
  Dim *in_stack_ffffffffffffffb8;
  float *t;
  
  boost::archive::detail::interface_iarchive<boost::archive::text_iarchive>::operator&
            ((interface_iarchive<boost::archive::text_iarchive> *)in_RDI,in_stack_ffffffffffffffb8);
  Dim::size(in_RDI);
  pvVar1 = cnn_mm_malloc(in_stack_00000010,in_stack_00000008);
  *(void **)(in_RDI[1].d + 1) = pvVar1;
  t = *(float **)(in_RDI[1].d + 1);
  Dim::size(in_RDI);
  boost::serialization::make_array<float,unsigned_int>(t,(uint)((ulong)in_RDI >> 0x20));
  boost::archive::detail::interface_iarchive<boost::archive::text_iarchive>::operator&
            ((interface_iarchive<boost::archive::text_iarchive> *)in_RDI,
             (array_wrapper<float> *)in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void load(Archive& ar, const unsigned int) {
    ar & d;
#if HAVE_CUDA
    CUDA_CHECK(cudaMalloc(&v, d.size() * sizeof(float)));
    float* vc = static_cast<float*>(std::malloc(d.size() * sizeof(float)));
    ar & boost::serialization::make_array(vc, d.size());
    CUDA_CHECK(cudaMemcpyAsync(v, vc, d.size() * sizeof(float), cudaMemcpyHostToDevice));
#else
    v = static_cast<float*>(cnn_mm_malloc(d.size() * sizeof(float), 32));
    ar & boost::serialization::make_array(v, d.size());
#endif
  }